

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_get_layer_resolution
               (int width_org,int height_org,int num,int den,int *width_out,int *height_out)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  
  if (((den != 0) && (width_out != (int *)0x0)) && (height_out != (int *)0x0)) {
    if (num != 1 || den != 1) {
      uVar1 = (long)(width_org * num) / (long)den;
      uVar2 = (long)(height_org * num) / (long)den;
      iVar3 = (int)uVar1;
      width_org = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar1 & 0xffffffff) % 2) +
                  iVar3;
      iVar3 = (int)uVar2;
      height_org = (int)((long)((ulong)(uint)(iVar3 >> 0x1f) << 0x20 | uVar2 & 0xffffffff) % 2) +
                   iVar3;
    }
    *width_out = width_org;
    *height_out = height_org;
  }
  return;
}

Assistant:

void av1_get_layer_resolution(const int width_org, const int height_org,
                              const int num, const int den, int *width_out,
                              int *height_out) {
  int w, h;
  if (width_out == NULL || height_out == NULL || den == 0) return;
  if (den == 1 && num == 1) {
    *width_out = width_org;
    *height_out = height_org;
    return;
  }
  w = width_org * num / den;
  h = height_org * num / den;
  // Make height and width even.
  w += w % 2;
  h += h % 2;
  *width_out = w;
  *height_out = h;
}